

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void xPredIntraAngAdi_XY_20(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  byte *pbVar8;
  pel first_line [192];
  undefined8 uStack_100;
  undefined1 local_f8 [200];
  
  iVar6 = iHeight * 2 + -1;
  pbVar8 = pSrc + -(long)iHeight;
  for (lVar7 = 0; lVar7 < iVar6; lVar7 = lVar7 + 2) {
    pbVar1 = pbVar8 + -1;
    bVar3 = *pbVar8;
    bVar4 = pbVar8[1];
    bVar5 = pbVar8[2];
    pbVar8 = pbVar8 + 1;
    local_f8[lVar7] = (char)((uint)*pbVar1 + (uint)bVar5 + ((uint)bVar4 + (uint)bVar3) * 3 + 4 >> 3)
    ;
    local_f8[lVar7 + 1] = (char)((uint)bVar3 + (uint)bVar4 * 2 + (uint)bVar5 + 2 >> 2);
  }
  for (lVar7 = lVar7 + -1; lVar7 < iWidth + -1 + iVar6; lVar7 = lVar7 + 1) {
    pbVar1 = pbVar8 + -1;
    bVar3 = *pbVar8;
    pbVar2 = pbVar8 + 1;
    pbVar8 = pbVar8 + 1;
    local_f8[lVar7] = (char)((uint)*pbVar1 + (uint)bVar3 * 2 + (uint)*pbVar2 + 2 >> 2);
  }
  lVar7 = 0;
  if (iHeight < 1) {
    iHeight = 0;
  }
  for (; -iHeight != (int)lVar7; lVar7 = lVar7 + -1) {
    uStack_100 = 0x11b29c;
    memcpy(dst,local_f8 + lVar7 * 2 + (long)iVar6 + -1,(long)iWidth);
    dst = dst + i_dst;
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_XY_20(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    ALIGNED_16(pel first_line[64 + 128]);
    int left_size = (iHeight - 1) * 2 + 1;
    int top_size = iWidth - 1;
    int line_size = left_size + top_size;
    int i;
    pel *pfirst = first_line + left_size - 1;

    pSrc -= iHeight;

    for (i = 0; i < left_size; i += 2, pSrc++) {
        first_line[i] = (pSrc[-1] + (pSrc[0] + pSrc[1]) * 3 + pSrc[2] + 4) >> 3;
        first_line[i + 1] = (pSrc[0] + pSrc[1] * 2 + pSrc[2] + 2) >> 2;
    }
    i--;

    for (; i < line_size; i++, pSrc++) {
        first_line[i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
    }

    for (i = 0; i < iHeight; i++) {
        memcpy(dst, pfirst, iWidth * sizeof(pel));
        pfirst -= 2;
        dst += i_dst;
    }
}